

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall
cmComputeLinkDepends::AddLinkEntries<cmLinkItem>
          (cmComputeLinkDepends *this,size_t depender_index,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *libs)

{
  size_t sVar1;
  cmGeneratorTarget *this_00;
  cmake *pcVar2;
  pointer pLVar3;
  pointer pLVar4;
  long lVar5;
  cmGlobalGenerator *__n;
  _Base_ptr p_Var6;
  iterator iVar7;
  pointer pcVar8;
  bool bVar9;
  cmMakefile *pcVar10;
  cmMakefile *pcVar11;
  pointer pLVar12;
  undefined8 uVar13;
  int iVar14;
  TargetType TVar15;
  string *psVar16;
  string *psVar17;
  string *psVar18;
  const_iterator cVar19;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var20;
  _Base_ptr p_Var21;
  _Map_pointer ppvVar22;
  _Rb_tree_node_base *p_Var23;
  pointer pLVar24;
  _Base_ptr p_Var25;
  pointer this_01;
  _Base_ptr p_Var26;
  pointer __s1;
  bool bVar27;
  pair<unsigned_long,_bool> pVar28;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  size_t dependee_index;
  pair<unsigned_long,_bool> groupIndex;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indexes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> groupItems;
  unsigned_long index;
  map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
  dependSets;
  _Map_pointer local_2d0;
  _Map_pointer local_2c8;
  char local_2c0;
  string local_2b8 [2];
  _Base_ptr local_278;
  size_t local_270;
  undefined1 local_268 [24];
  cmGlobalGenerator *local_250;
  _Alloc_hider local_248;
  size_type local_240;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  _Base_ptr p_Stack_218;
  _Base_ptr local_210;
  _Base_ptr local_208;
  char *local_200;
  undefined1 local_1f8 [8];
  _Base_ptr local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  _Base_ptr local_1e0;
  _Base_ptr local_1d8;
  char *local_1d0;
  undefined1 local_1c8 [8];
  _Base_ptr local_1c0;
  _Base_ptr local_1b8;
  _Base_ptr local_1b0;
  _Base_ptr local_1a8;
  char *local_1a0;
  undefined1 local_198 [8];
  _Base_ptr local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  _Base_ptr local_180;
  _Base_ptr local_178;
  char *local_170;
  undefined1 local_168 [16];
  _Base_ptr local_158;
  _Base_ptr local_150;
  _Base_ptr local_148;
  char *local_140;
  undefined1 local_138 [16];
  _Alloc_hider local_128;
  _Base_ptr local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  cmLinkItem *local_108;
  _Base_ptr local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  _Alloc_hider local_e0;
  _Base_ptr local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8 [2];
  vector<unsigned_long,std::allocator<unsigned_long>> *local_88;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
  *local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  pointer local_68;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>,_std::_Select1st<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_270 = 0xffffffffffffffff;
  local_2c8 = (_Map_pointer)0xffffffffffffffff;
  local_2c0 = '\0';
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01 = (libs->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_68 = (libs->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this_01 != local_68) {
    local_88 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->OriginalEntries;
    local_80 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                *)&this->GroupItems;
    local_70 = (_Base_ptr)&this->LinkLibraryOverride;
    local_78 = &(this->LinkLibraryOverride)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_100 = &(this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header;
    bVar9 = false;
    do {
      psVar16 = cmLinkItem::AsStr_abi_cxx11_(this_01);
      psVar17 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      sVar1 = psVar16->_M_string_length;
      if (((sVar1 != psVar17->_M_string_length) ||
          ((sVar1 != 0 &&
           (iVar14 = bcmp((psVar16->_M_dataplus)._M_p,(psVar17->_M_dataplus)._M_p,sVar1),
           iVar14 != 0)))) &&
         (psVar16 = cmLinkItem::AsStr_abi_cxx11_(this_01), psVar16->_M_string_length != 0)) {
        psVar16 = &this_01->Feature;
        sVar1 = (this_01->Feature)._M_string_length;
        if (sVar1 == cmLinkItem::DEFAULT_abi_cxx11_._M_string_length) {
          if ((sVar1 != 0) &&
             (bVar27 = local_270 != depender_index,
             iVar14 = bcmp((psVar16->_M_dataplus)._M_p,
                           cmLinkItem::DEFAULT_abi_cxx11_._M_dataplus._M_p,sVar1),
             iVar14 != 0 && bVar27)) {
LAB_00564088:
            pLVar24 = (this->EntryList).
                      super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            this_00 = pLVar24[depender_index].Target;
            if ((this_00 != (cmGeneratorTarget *)0x0) &&
               ((bVar27 = cmGeneratorTarget::IsImported(this_00), bVar27 &&
                (bVar27 = anon_unknown.dwarf_242aa0c::IsFeatureSupported
                                    ((anon_unknown_dwarf_242aa0c *)this->Makefile,
                                     (cmMakefile *)(this->LinkLanguage)._M_dataplus._M_p,
                                     (string *)(this->LinkLanguage)._M_string_length,psVar16),
                !bVar27)))) {
              pcVar2 = this->CMakeInstance;
              psVar17 = cmGeneratorTarget::GetName_abi_cxx11_(pLVar24[depender_index].Target);
              local_268._0_8_ = (cmMakefile *)0x17;
              local_268._8_8_ = "The \'IMPORTED\' target \'";
              local_268._16_8_ = (cmMakefile *)0x0;
              local_248._M_p = (psVar17->_M_dataplus)._M_p;
              local_250 = (cmGlobalGenerator *)psVar17->_M_string_length;
              local_240 = 0;
              local_238._0_8_ = 0x44;
              local_238._8_8_ =
                   "\' uses the generator-expression \'$<LINK_LIBRARY>\' with the feature \'";
              local_228._0_8_ = 0;
              p_Stack_218 = (_Base_ptr)(this_01->Feature)._M_dataplus._M_p;
              local_228._8_8_ = (this_01->Feature)._M_string_length;
              local_210 = (_Base_ptr)0x0;
              local_208 = (_Base_ptr)0x5c;
              local_200 = 
              "\', which is undefined or unsupported.\nDid you miss to define it by setting variables \"CMAKE_"
              ;
              local_1f8 = (undefined1  [8])0x0;
              local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(this->LinkLanguage)._M_dataplus._M_p;
              local_1f0 = (_Base_ptr)(this->LinkLanguage)._M_string_length;
              local_1e0 = (_Base_ptr)0x0;
              local_1d8 = (_Base_ptr)&DAT_00000014;
              local_1d0 = "_LINK_LIBRARY_USING_";
              local_1c8 = (undefined1  [8])0x0;
              local_1b0 = (_Base_ptr)0x0;
              local_1a8 = (_Base_ptr)0xd;
              local_1a0 = "\" and \"CMAKE_";
              local_198 = (undefined1  [8])0x0;
              local_180 = (_Base_ptr)0x0;
              local_178 = (_Base_ptr)&DAT_00000014;
              local_170 = "_LINK_LIBRARY_USING_";
              local_168._0_8_ = 0;
              local_150 = (_Base_ptr)0x0;
              local_148 = (_Base_ptr)0xc;
              local_140 = "_SUPPORTED\"?";
              local_138._0_8_ = 0;
              views._M_len = 0xd;
              views._M_array = (iterator)local_268;
              local_1c0 = (_Base_ptr)local_228._8_8_;
              local_1b8 = p_Stack_218;
              local_190 = local_1f0;
              local_188 = local_1e8;
              local_168._8_8_ = local_228._8_8_;
              local_158 = p_Stack_218;
              cmCatViews(local_2b8,views);
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_268);
              cmake::IssueMessage(pcVar2,AUTHOR_ERROR,local_2b8,(cmListFileBacktrace *)local_268);
              if ((cmMakefile *)local_268._8_8_ != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8[0]._M_dataplus._M_p != &local_2b8[0].field_2) {
                operator_delete(local_2b8[0]._M_dataplus._M_p,
                                (ulong)(local_2b8[0].field_2._M_allocated_capacity + 1));
              }
            }
          }
        }
        else if (local_270 != depender_index) goto LAB_00564088;
        psVar17 = cmLinkItem::AsStr_abi_cxx11_(this_01);
        local_268._8_8_ = (psVar17->_M_dataplus)._M_p;
        local_268._0_8_ = psVar17->_M_string_length;
        __str._M_str = (char *)DAT_00a39708;
        __str._M_len = (size_t)(anonymous_namespace)::LG_BEGIN;
        iVar14 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_268,0,
                            (size_type)(anonymous_namespace)::LG_BEGIN,__str);
        local_108 = this_01;
        if (iVar14 == 0) {
          psVar17 = cmLinkItem::AsStr_abi_cxx11_(this_01);
          if ((psVar17->_M_string_length != 0) &&
             ((psVar17->_M_dataplus)._M_p[psVar17->_M_string_length - 1] == '>')) {
            pVar28 = AddLinkEntry(this,this_01,local_270);
            ppvVar22 = (_Map_pointer)pVar28.first;
            local_2c0 = pVar28.second;
            local_2c8 = ppvVar22;
            if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pLVar24 = (this->EntryList).
                        super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              psVar16 = cmLinkItem::AsStr_abi_cxx11_(this_01);
              std::__cxx11::string::find((char)psVar16,0x3a);
              std::__cxx11::string::substr((ulong)local_268,(ulong)psVar16);
              std::__cxx11::string::operator=
                        ((string *)&pLVar24[(long)ppvVar22].Feature,(string *)local_268);
              this_01 = local_108;
              if ((cmMakefile *)local_268._0_8_ != (cmMakefile *)(local_268 + 0x10)) {
                operator_delete((void *)local_268._0_8_,
                                (ulong)((long)&(((deque<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  *)local_268._16_8_)->
                                               super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                               )._M_impl.super__Deque_impl_data._M_map + 1));
              }
            }
            if (local_270 == depender_index) {
              iVar7._M_current =
                   (this->OriginalEntries).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar7._M_current ==
                  (this->OriginalEntries).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                bVar9 = true;
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>(local_88,iVar7,(unsigned_long *)&local_2c8);
                goto LAB_005656db;
              }
              *iVar7._M_current = (unsigned_long)local_2c8;
              (this->OriginalEntries).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            else {
              pcVar8 = (this->EntryConstraintGraph).
                       super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                       super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl
                       .super__Vector_impl_data._M_start;
              local_2b8[0]._M_dataplus._M_p = local_2b8[0]._M_dataplus._M_p & 0xffffffffffffff00;
              local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffffffffff00;
              local_268._0_8_ = (cmMakefile *)0x0;
              local_268._8_8_ = (cmMakefile *)0x0;
              cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                        ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_268);
              std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
              emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace>
                        ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                         (pcVar8 + depender_index),(unsigned_long *)&local_2c8,(bool *)local_2b8,
                         (bool *)local_c0._M_local_buf,(cmListFileBacktrace *)local_268);
              if ((cmMakefile *)local_268._8_8_ != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
              }
            }
            bVar9 = true;
            goto LAB_005656db;
          }
        }
        psVar17 = cmLinkItem::AsStr_abi_cxx11_(this_01);
        local_268._8_8_ = (psVar17->_M_dataplus)._M_p;
        local_268._0_8_ = psVar17->_M_string_length;
        __str_00._M_str = DAT_00a39718;
        __str_00._M_len = (anonymous_namespace)::LG_END;
        iVar14 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_268,0,
                            (anonymous_namespace)::LG_END,__str_00);
        if (iVar14 == 0) {
          psVar17 = cmLinkItem::AsStr_abi_cxx11_(this_01);
          if ((psVar17->_M_string_length != 0) &&
             ((psVar17->_M_dataplus)._M_p[psVar17->_M_string_length - 1] == '>')) {
            local_2d0 = local_2c8;
            if (local_2c0 == '\x01') {
              std::
              _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
              ::
              _M_emplace_unique<unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                        (local_80,(unsigned_long *)&local_2c8,&local_f8);
            }
            local_2c8 = (_Map_pointer)0xffffffffffffffff;
            local_2c0 = '\0';
            if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            bVar9 = false;
            goto LAB_005656db;
          }
        }
        ppvVar22 = local_2c8;
        if ((local_270 != depender_index) && (bVar9)) {
          pLVar24 = (this->EntryList).
                    super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pLVar24[depender_index].Target != (cmGeneratorTarget *)0x0) &&
             (bVar27 = cmGeneratorTarget::IsImported(pLVar24[depender_index].Target), bVar27)) {
            psVar17 = &pLVar24[(long)ppvVar22].Feature;
            bVar27 = anon_unknown.dwarf_242aa0c::IsGroupFeatureSupported
                               ((anon_unknown_dwarf_242aa0c *)this->Makefile,
                                (cmMakefile *)(this->LinkLanguage)._M_dataplus._M_p,
                                (string *)(this->LinkLanguage)._M_string_length,psVar17);
            if (!bVar27) {
              pcVar2 = this->CMakeInstance;
              psVar18 = cmGeneratorTarget::GetName_abi_cxx11_(pLVar24[depender_index].Target);
              local_268._0_8_ = (cmMakefile *)0x17;
              local_268._8_8_ = "The \'IMPORTED\' target \'";
              local_268._16_8_ = (cmMakefile *)0x0;
              local_248._M_p = (psVar18->_M_dataplus)._M_p;
              local_250 = (cmGlobalGenerator *)psVar18->_M_string_length;
              local_240 = 0;
              local_238._0_8_ = 0x42;
              local_238._8_8_ =
                   "\' uses the generator-expression \'$<LINK_GROUP>\' with the feature \'";
              local_228._0_8_ = 0;
              p_Stack_218 = (_Base_ptr)(psVar17->_M_dataplus)._M_p;
              local_228._8_8_ = pLVar24[(long)ppvVar22].Feature._M_string_length;
              local_210 = (_Base_ptr)0x0;
              local_208 = (_Base_ptr)0x5c;
              local_200 = 
              "\', which is undefined or unsupported.\nDid you miss to define it by setting variables \"CMAKE_"
              ;
              local_1f8 = (undefined1  [8])0x0;
              local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(this->LinkLanguage)._M_dataplus._M_p;
              local_1f0 = (_Base_ptr)(this->LinkLanguage)._M_string_length;
              local_1e0 = (_Base_ptr)0x0;
              local_1d8 = (_Base_ptr)0x12;
              local_1d0 = "_LINK_GROUP_USING_";
              local_1c8 = (undefined1  [8])0x0;
              local_1b8 = (_Base_ptr)(psVar17->_M_dataplus)._M_p;
              local_1c0 = (_Base_ptr)pLVar24[(long)ppvVar22].Feature._M_string_length;
              local_1b0 = (_Base_ptr)0x0;
              local_1a8 = (_Base_ptr)0xd;
              local_1a0 = "\" and \"CMAKE_";
              local_198 = (undefined1  [8])0x0;
              local_180 = (_Base_ptr)0x0;
              local_178 = (_Base_ptr)0x12;
              local_170 = "_LINK_GROUP_USING_";
              local_168._0_8_ = 0;
              local_158 = (_Base_ptr)(psVar17->_M_dataplus)._M_p;
              local_168._8_8_ = pLVar24[(long)ppvVar22].Feature._M_string_length;
              local_150 = (_Base_ptr)0x0;
              local_148 = (_Base_ptr)0xc;
              local_140 = "_SUPPORTED\"?";
              local_138._0_8_ = 0;
              views_00._M_len = 0xd;
              views_00._M_array = (iterator)local_268;
              local_190 = local_1f0;
              local_188 = local_1e8;
              cmCatViews(local_2b8,views_00);
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_268);
              cmake::IssueMessage(pcVar2,AUTHOR_ERROR,local_2b8,(cmListFileBacktrace *)local_268);
              if ((cmMakefile *)local_268._8_8_ != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8[0]._M_dataplus._M_p != &local_2b8[0].field_2) {
                operator_delete(local_2b8[0]._M_dataplus._M_p,
                                (ulong)(local_2b8[0].field_2._M_allocated_capacity + 1));
              }
            }
          }
        }
        pVar28 = AddLinkEntry(this,this_01,(size_t)local_2c8);
        local_2d0 = (_Map_pointer)pVar28.first;
        pLVar24 = (this->EntryList).
                  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)local_2d0;
        cVar19 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_70,(key_type *)pLVar24);
        p_Var26 = cVar19._M_node + 2;
        if (cVar19._M_node == local_78) {
          p_Var26 = (_Base_ptr)psVar16;
        }
        if (bVar9) {
          if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if ((pLVar24->Target != (cmGeneratorTarget *)0x0) &&
               ((TVar15 = cmGeneratorTarget::GetType(pLVar24->Target), TVar15 == OBJECT_LIBRARY ||
                (TVar15 = cmGeneratorTarget::GetType(pLVar24->Target), TVar15 == INTERFACE_LIBRARY))
               )) {
              ppvVar22 = local_2c8;
              pcVar2 = this->CMakeInstance;
              pLVar3 = (this->EntryList).
                       super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_278 = p_Var26;
              TVar15 = cmGeneratorTarget::GetType(pLVar24->Target);
              local_1d0 = "INTERFACE";
              if (TVar15 == OBJECT_LIBRARY) {
                local_1d0 = "OBJECT";
              }
              local_268._0_8_ = (cmMakefile *)0xd;
              local_268._8_8_ = "The feature \'";
              local_268._16_8_ = (cmMakefile *)0x0;
              local_248._M_p = pLVar3[(long)ppvVar22].Feature._M_dataplus._M_p;
              local_250 = (cmGlobalGenerator *)pLVar3[(long)ppvVar22].Feature._M_string_length;
              local_240 = 0;
              local_238._0_8_ = 0x31;
              local_238._8_8_ = "\', specified as part of a generator-expression \'$";
              local_228._0_8_ = 0;
              local_228._8_8_ = (anonymous_namespace)::LG_BEGIN;
              p_Stack_218 = DAT_00a39708;
              local_210 = (_Base_ptr)0x0;
              local_200 = pLVar3[(long)ppvVar22].Feature._M_dataplus._M_p;
              local_208 = (_Base_ptr)pLVar3[(long)ppvVar22].Feature._M_string_length;
              local_1f8 = (undefined1  [8])0x0;
              local_1f0 = (_Base_ptr)0x1f;
              local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x7ffce4;
              local_1e0 = (_Base_ptr)0x0;
              local_1d8 = (_Base_ptr)((ulong)(TVar15 != OBJECT_LIBRARY) * 3 + 6);
              local_1c8 = (undefined1  [8])0x0;
              local_1c0 = (_Base_ptr)0xa;
              local_1b8 = (_Base_ptr)0x7ffd04;
              local_1b0 = (_Base_ptr)0x0;
              local_1a0 = (pLVar24->Item).Value._M_dataplus._M_p;
              local_1a8 = (_Base_ptr)(pLVar24->Item).Value._M_string_length;
              local_198 = (undefined1  [8])0x0;
              local_190 = (_Base_ptr)0x2;
              local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x7f7589;
              local_180 = (_Base_ptr)0x0;
              views_01._M_len = 10;
              views_01._M_array = (iterator)local_268;
              cmCatViews(local_2b8,views_01);
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_268);
              cmake::IssueMessage(pcVar2,AUTHOR_WARNING,local_2b8,(cmListFileBacktrace *)local_268);
              p_Var26 = local_278;
              if ((cmMakefile *)local_268._8_8_ != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8[0]._M_dataplus._M_p != &local_2b8[0].field_2) {
                operator_delete(local_2b8[0]._M_dataplus._M_p,
                                (ulong)(local_2b8[0].field_2._M_allocated_capacity + 1));
              }
            }
LAB_00564890:
            p_Var21 = p_Var26->_M_parent;
            if ((((p_Var21 != (_Base_ptr)cmLinkItem::DEFAULT_abi_cxx11_._M_string_length) ||
                 ((p_Var21 != (_Base_ptr)0x0 &&
                  (iVar14 = bcmp(*(void **)p_Var26,cmLinkItem::DEFAULT_abi_cxx11_._M_dataplus._M_p,
                                 (size_t)p_Var21), iVar14 != 0)))) &&
                (pLVar24->Target != (cmGeneratorTarget *)0x0)) &&
               ((TVar15 = cmGeneratorTarget::GetType(pLVar24->Target), TVar15 == OBJECT_LIBRARY ||
                (TVar15 = cmGeneratorTarget::GetType(pLVar24->Target), TVar15 == INTERFACE_LIBRARY))
               )) {
              pcVar2 = this->CMakeInstance;
              TVar15 = cmGeneratorTarget::GetType(pLVar24->Target);
              local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x7d6b27;
              if (TVar15 == OBJECT_LIBRARY) {
                local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x7c2a3e;
              }
              local_268._0_8_ = (cmMakefile *)0xd;
              local_268._8_8_ = "The feature \'";
              local_268._16_8_ = (cmMakefile *)0x0;
              local_248._M_p = *(pointer *)p_Var26;
              local_250 = (cmGlobalGenerator *)p_Var26->_M_parent;
              local_240 = 0;
              local_238._0_8_ = 0x3f;
              local_238._8_8_ = "\', specified as part of a generator-expression \'$<LINK_LIBRARY:";
              local_228._0_8_ = 0;
              local_228._8_8_ = p_Var26->_M_parent;
              local_210 = (_Base_ptr)0x0;
              local_208 = (_Base_ptr)0x1f;
              local_200 = ">\', will not be applied to the ";
              local_1f8 = (undefined1  [8])0x0;
              local_1f0 = (_Base_ptr)((ulong)(TVar15 != OBJECT_LIBRARY) * 3 + 6);
              local_1e0 = (_Base_ptr)0x0;
              local_1d8 = (_Base_ptr)0xa;
              local_1d0 = " library \'";
              local_1c8 = (undefined1  [8])0x0;
              local_1b8 = (_Base_ptr)(pLVar24->Item).Value._M_dataplus._M_p;
              local_1c0 = (_Base_ptr)(pLVar24->Item).Value._M_string_length;
              local_1b0 = (_Base_ptr)0x0;
              local_1a8 = (_Base_ptr)0x2;
              local_1a0 = "\'.";
              local_198 = (undefined1  [8])0x0;
              views_02._M_len = 9;
              views_02._M_array = (iterator)local_268;
              p_Stack_218 = (_Base_ptr)local_248._M_p;
              cmCatViews(local_2b8,views_02);
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_268);
              cmake::IssueMessage(pcVar2,AUTHOR_WARNING,local_2b8,(cmListFileBacktrace *)local_268);
              if ((cmMakefile *)local_268._8_8_ != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8[0]._M_dataplus._M_p != &local_2b8[0].field_2) {
                operator_delete(local_2b8[0]._M_dataplus._M_p,
                                (ulong)(local_2b8[0].field_2._M_allocated_capacity + 1));
              }
            }
            std::__cxx11::string::_M_assign((string *)&pLVar24->Feature);
          }
        }
        else if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_00564890;
        if ((pLVar24->Target == (cmGeneratorTarget *)0x0) ||
           ((TVar15 = cmGeneratorTarget::GetType(pLVar24->Target), TVar15 != OBJECT_LIBRARY &&
            (TVar15 = cmGeneratorTarget::GetType(pLVar24->Target), TVar15 != INTERFACE_LIBRARY)))) {
          ppvVar22 = local_2c8;
          local_278 = p_Var26;
          if ((bVar9) &&
             (p_Var21 = (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             p_Var21 != local_100)) {
            pLVar3 = (this->EntryList).
                     super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pLVar12 = pLVar3 + (long)local_2c8;
            do {
              pLVar4 = (this->EntryList).
                       super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar5 = *(long *)(p_Var21 + 1);
              sVar1 = pLVar4[lVar5].Feature._M_string_length;
              if (((sVar1 != pLVar3[(long)ppvVar22].Feature._M_string_length) ||
                  ((sVar1 != 0 &&
                   (iVar14 = bcmp(pLVar4[lVar5].Feature._M_dataplus._M_p,
                                  (pLVar12->Feature)._M_dataplus._M_p,sVar1), iVar14 != 0)))) &&
                 (_Var20 = std::
                           __find_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                                     (p_Var21[1]._M_parent,p_Var21[1]._M_left,&local_2d0),
                 (_Base_ptr)_Var20._M_current != p_Var21[1]._M_left)) {
                pcVar2 = this->CMakeInstance;
                psVar16 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
                local_268._0_8_ = (cmMakefile *)0x1b;
                local_268._8_8_ = "Impossible to link target \'";
                local_268._16_8_ = (cmMakefile *)0x0;
                local_248._M_p = (psVar16->_M_dataplus)._M_p;
                local_250 = (cmGlobalGenerator *)psVar16->_M_string_length;
                local_240 = 0;
                local_238._0_8_ = 0x19;
                local_238._8_8_ = "\' because the link item \'";
                local_228._0_8_ = 0;
                p_Stack_218 = (_Base_ptr)(pLVar24->Item).Value._M_dataplus._M_p;
                local_228._8_8_ = (pLVar24->Item).Value._M_string_length;
                local_210 = (_Base_ptr)0x0;
                local_208 = (_Base_ptr)0x25;
                local_200 = "\', specified with the group feature \'";
                local_1f8 = (undefined1  [8])0x0;
                local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(pLVar12->Feature)._M_dataplus._M_p;
                local_1f0 = (_Base_ptr)pLVar3[(long)ppvVar22].Feature._M_string_length;
                local_1e0 = (_Base_ptr)0x0;
                local_2b8[0]._M_dataplus._M_p = (pointer)0x0;
                local_2b8[0]._M_string_length = 1;
                local_2b8[0].field_2._0_8_ = (long)&local_2b8[0].field_2 + 8;
                local_2b8[0].field_2._M_local_buf[8] = '\'';
                local_1d8 = (_Base_ptr)0x1;
                local_1c8 = (undefined1  [8])0x0;
                local_1c0 = (_Base_ptr)0x29;
                local_1b8 = (_Base_ptr)0x7ffdab;
                local_1b0 = (_Base_ptr)0x0;
                local_1a0 = pLVar4[lVar5].Feature._M_dataplus._M_p;
                local_1a8 = (_Base_ptr)pLVar4[lVar5].Feature._M_string_length;
                local_198 = (undefined1  [8])0x0;
                local_c0._M_allocated_capacity = 0;
                local_c0._8_8_ = 1;
                local_188 = local_a8;
                local_a8[0]._M_local_buf[0] = 0x27;
                local_190 = (_Base_ptr)0x1;
                local_180 = (_Base_ptr)0x0;
                local_178 = (_Base_ptr)0x17;
                local_170 = ", which is not allowed.";
                local_168._0_8_ = 0;
                views_03._M_len = 0xb;
                views_03._M_array = (iterator)local_268;
                local_1d0 = (char *)local_2b8[0].field_2._0_8_;
                local_b0 = local_188;
                cmCatViews((string *)&local_128,views_03);
                cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_268);
                cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_128,
                                    (cmListFileBacktrace *)local_268);
                if ((cmMakefile *)local_268._8_8_ != (cmMakefile *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_128._M_p != &local_118) {
                  operator_delete(local_128._M_p,(ulong)(local_118._M_allocated_capacity + 1));
                }
              }
              p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
            } while (p_Var21 != local_100);
          }
          this_01 = local_108;
          p_Var26 = local_278;
          p_Var21 = (_Base_ptr)(pLVar24->Feature)._M_string_length;
          if ((p_Var21 != local_278->_M_parent) ||
             ((p_Var21 != (_Base_ptr)0x0 &&
              (iVar14 = bcmp((pLVar24->Feature)._M_dataplus._M_p,*(void **)local_278,(size_t)p_Var21
                            ), iVar14 != 0)))) {
            pcVar2 = this->CMakeInstance;
            psVar16 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
            __n = (cmGlobalGenerator *)p_Var26->_M_parent;
            if (__n == (cmGlobalGenerator *)cmLinkItem::DEFAULT_abi_cxx11_._M_string_length) {
              if (__n != (cmGlobalGenerator *)0x0) {
                __s1 = *(pointer *)p_Var26;
                iVar14 = bcmp(__s1,cmLinkItem::DEFAULT_abi_cxx11_._M_dataplus._M_p,(size_t)__n);
                if (iVar14 != 0) goto LAB_0056500c;
              }
              local_128._M_p = (pointer)&local_118;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_128,"without any feature or \'DEFAULT\' feature","");
            }
            else {
              __s1 = *(pointer *)p_Var26;
LAB_0056500c:
              local_268._0_8_ = (cmMakefile *)0x12;
              local_268._8_8_ = "with the feature \'";
              local_268._16_8_ = (cmMakefile *)0x0;
              local_240 = 0;
              local_2b8[0]._M_dataplus._M_p = (pointer)0x0;
              local_2b8[0]._M_string_length = 1;
              local_2b8[0].field_2._0_8_ = (long)&local_2b8[0].field_2 + 8;
              local_2b8[0].field_2._M_local_buf[8] = '\'';
              local_238._0_8_ = 1;
              local_228._0_8_ = 0;
              views_04._M_len = 3;
              views_04._M_array = (iterator)local_268;
              local_250 = __n;
              local_248._M_p = __s1;
              local_238._8_8_ = local_2b8[0].field_2._0_8_;
              cmCatViews((string *)&local_128,views_04);
            }
            sVar1 = (pLVar24->Feature)._M_string_length;
            if ((sVar1 == cmLinkItem::DEFAULT_abi_cxx11_._M_string_length) &&
               ((sVar1 == 0 ||
                (iVar14 = bcmp((pLVar24->Feature)._M_dataplus._M_p,
                               cmLinkItem::DEFAULT_abi_cxx11_._M_dataplus._M_p,sVar1), iVar14 == 0))
               )) {
              local_e0._M_p = (pointer)&local_d0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e0,"without any feature or \'DEFAULT\' feature","");
            }
            else {
              local_268._0_8_ = (cmTarget *)0x12;
              local_268._8_8_ = "with the feature \'";
              local_268._16_8_ = (cmLocalGenerator *)0x0;
              local_248._M_p = (pLVar24->Feature)._M_dataplus._M_p;
              local_250 = (cmGlobalGenerator *)(pLVar24->Feature)._M_string_length;
              local_240 = 0;
              local_2b8[0]._M_dataplus._M_p = (pointer)0x0;
              local_2b8[0]._M_string_length = 1;
              local_2b8[0].field_2._0_8_ = (long)&local_2b8[0].field_2 + 8;
              local_2b8[0].field_2._M_local_buf[8] = '\'';
              local_238._0_8_ = 1;
              local_228._0_8_ = 0;
              views_05._M_len = 3;
              views_05._M_array = (iterator)local_268;
              local_238._8_8_ = local_2b8[0].field_2._0_8_;
              cmCatViews((string *)&local_e0,views_05);
            }
            local_268._0_8_ = (cmMakefile *)0x1b;
            local_268._8_8_ = "Impossible to link target \'";
            local_268._16_8_ = (cmMakefile *)0x0;
            local_248._M_p = (psVar16->_M_dataplus)._M_p;
            local_250 = (cmGlobalGenerator *)psVar16->_M_string_length;
            local_240 = 0;
            local_238._0_8_ = 0x19;
            local_238._8_8_ = "\' because the link item \'";
            local_228._0_8_ = 0;
            p_Stack_218 = (_Base_ptr)(pLVar24->Item).Value._M_dataplus._M_p;
            local_228._8_8_ = (pLVar24->Item).Value._M_string_length;
            local_210 = (_Base_ptr)0x0;
            local_208 = (_Base_ptr)0xd;
            local_200 = "\', specified ";
            local_1f8 = (undefined1  [8])0x0;
            local_1f0 = local_120;
            local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_128._M_p;
            local_1e0 = (_Base_ptr)&local_128;
            local_1d8 = (_Base_ptr)0x17;
            local_1d0 = ", has already occurred ";
            local_1c8 = (undefined1  [8])0x0;
            local_1c0 = local_d8;
            local_1b8 = (_Base_ptr)local_e0._M_p;
            local_1b0 = (_Base_ptr)&local_e0;
            local_1a8 = (_Base_ptr)0x17;
            local_1a0 = ", which is not allowed.";
            local_198 = (undefined1  [8])0x0;
            views_06._M_len = 9;
            views_06._M_array = (iterator)local_268;
            cmCatViews((string *)&local_c0,views_06);
            cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_268);
            this_01 = local_108;
            cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_c0,
                                (cmListFileBacktrace *)local_268);
            if ((cmMakefile *)local_268._8_8_ != (cmMakefile *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)local_c0._M_allocated_capacity != &local_b0) {
              operator_delete((void *)local_c0._M_allocated_capacity,(ulong)((long)local_b0 + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_p != &local_d0) {
              operator_delete(local_e0._M_p,(ulong)(local_d0._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_p != &local_118) {
              operator_delete(local_128._M_p,(ulong)(local_118._M_allocated_capacity + 1));
            }
          }
        }
        if (bVar9) {
          if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_f8,
                       (iterator)
                       local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_2d0);
          }
          else {
            *local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)local_2d0;
            local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_268._0_8_ = (cmMakefile *)0x0;
          local_268._8_8_ = (cmMakefile *)0x0;
          local_268._16_8_ = (cmMakefile *)0x0;
          p_Var21 = (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (p_Var21 == local_100) {
LAB_00565530:
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_268,
                       (iterator)local_268._8_8_,(unsigned_long *)&local_2d0);
            pcVar10 = (cmMakefile *)local_268._0_8_;
            pcVar11 = (cmMakefile *)local_268._8_8_;
          }
          else {
            bVar27 = false;
            do {
              p_Var25 = p_Var21[1]._M_parent;
              p_Var6 = p_Var21[1]._M_left;
              if (p_Var25 != p_Var6) {
                local_278 = p_Var21 + 1;
                pLVar3 = (this->EntryList).
                         super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                sVar1 = (pLVar24->Item).Value._M_string_length;
                do {
                  if ((sVar1 == pLVar3[*(long *)p_Var25].Item.Value._M_string_length) &&
                     ((sVar1 == 0 ||
                      (iVar14 = bcmp((pLVar24->Item).Value._M_dataplus._M_p,
                                     pLVar3[*(long *)p_Var25].Item.Value._M_dataplus._M_p,sVar1),
                      iVar14 == 0)))) {
                    if (local_268._8_8_ == local_268._16_8_) {
                      bVar27 = true;
                      std::vector<unsigned_long,std::allocator<unsigned_long>>::
                      _M_realloc_insert<unsigned_long_const&>
                                ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_268,
                                 (iterator)local_268._8_8_,(unsigned_long *)local_278);
                    }
                    else {
                      *(unsigned_long *)local_268._8_8_ = *(unsigned_long *)local_278;
                      local_268._8_8_ = local_268._8_8_ + 8;
                      bVar27 = true;
                    }
                    break;
                  }
                  p_Var25 = (_Base_ptr)&p_Var25->_M_parent;
                } while (p_Var25 != p_Var6);
              }
              p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
            } while (p_Var21 != local_100);
            pcVar10 = (cmMakefile *)local_268._0_8_;
            pcVar11 = (cmMakefile *)local_268._8_8_;
            if (!bVar27) {
              if (local_268._8_8_ == local_268._16_8_) goto LAB_00565530;
              (((deque<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)local_268._8_8_)->
              super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              )._M_impl.super__Deque_impl_data._M_map = local_2d0;
              local_268._8_8_ =
                   &(((deque<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)local_268._8_8_)->
                    super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    )._M_impl.super__Deque_impl_data._M_map_size;
              pcVar11 = (cmMakefile *)local_268._8_8_;
            }
          }
          for (; uVar13 = local_268._8_8_, pcVar10 != (cmMakefile *)local_268._8_8_;
              pcVar10 = (cmMakefile *)
                        &(pcVar10->FindPackageRootPathStack).
                         super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_map_size) {
            local_c0._M_allocated_capacity =
                 (size_type)
                 (pcVar10->FindPackageRootPathStack).
                 super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map;
            if (local_270 == depender_index) {
              iVar7._M_current =
                   (this->OriginalEntries).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar7._M_current ==
                  (this->OriginalEntries).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                local_268._8_8_ = pcVar11;
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          (local_88,iVar7,&local_c0._M_allocated_capacity);
                p_Var23 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              else {
                *iVar7._M_current = local_c0._M_allocated_capacity;
                (this->OriginalEntries).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar7._M_current + 1;
                p_Var23 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
                local_268._8_8_ = pcVar11;
              }
            }
            else {
              pcVar8 = (this->EntryConstraintGraph).
                       super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                       super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl
                       .super__Vector_impl_data._M_start;
              local_128._M_p = local_128._M_p & 0xffffffffffffff00;
              local_e0._M_p = local_e0._M_p & 0xffffffffffffff00;
              local_2b8[0]._M_dataplus._M_p = (pointer)0x0;
              local_2b8[0]._M_string_length = 0;
              local_268._8_8_ = pcVar11;
              cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                        ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_2b8);
              std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
              emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace>
                        ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                         (pcVar8 + depender_index),&local_c0._M_allocated_capacity,
                         (bool *)&local_128,(bool *)&local_e0,(cmListFileBacktrace *)local_2b8);
              p_Var23 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8[0]._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_2b8[0]._M_string_length);
                p_Var23 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
              }
            }
            for (; (_Rb_tree_header *)p_Var23 != &local_60._M_impl.super__Rb_tree_header;
                p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23)) {
              pLVar24 = (this->EntryList).
                        super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((pLVar24[local_c0._M_allocated_capacity].Target == (cmGeneratorTarget *)0x0) &&
                  (1 < pLVar24[local_c0._M_allocated_capacity].Kind - Flag)) &&
                 (local_2d0 != *(_Map_pointer *)(p_Var23 + 1))) {
                std::
                _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                ::_M_insert_unique<unsigned_long_const&>
                          ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                            *)&p_Var23[1]._M_parent,&local_c0._M_allocated_capacity);
              }
            }
            if ((this->InferredDependSets).
                super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
                ._M_impl.super__Vector_impl_data._M_start[local_c0._M_allocated_capacity].
                Initialized != false) {
              std::
              map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
              ::operator[]((map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
                            *)&local_60,&local_c0._M_allocated_capacity);
            }
            pcVar11 = (cmMakefile *)local_268._8_8_;
            local_268._8_8_ = uVar13;
          }
          this_01 = local_108;
          local_268._8_8_ = pcVar11;
          if ((cmMakefile *)local_268._0_8_ != (cmMakefile *)0x0) {
            operator_delete((void *)local_268._0_8_,local_268._16_8_ - local_268._0_8_);
            this_01 = local_108;
          }
        }
      }
LAB_005656db:
      this_01 = this_01 + 1;
      p_Var23 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (this_01 != local_68);
    for (; (_Rb_tree_header *)p_Var23 != &local_60._M_impl.super__Rb_tree_header;
        p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23)) {
      std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
      ::push_back(&(this->InferredDependSets).
                   super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
                   ._M_impl.super__Vector_impl_data._M_start[*(long *)(p_Var23 + 1)].
                   super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                  ,(value_type *)&p_Var23[1]._M_parent);
    }
  }
  if ((_Base_ptr)
      local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>,_std::_Select1st<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmComputeLinkDepends::AddLinkEntries(size_t depender_index,
                                          std::vector<T> const& libs)
{
  // Track inferred dependency sets implied by this list.
  std::map<size_t, DependSet> dependSets;

  bool inGroup = false;
  std::pair<size_t, bool> groupIndex{
    cmComputeComponentGraph::INVALID_COMPONENT, false
  };
  std::vector<size_t> groupItems;

  // Loop over the libraries linked directly by the depender.
  for (T const& l : libs) {
    // Skip entries that will resolve to the target getting linked or
    // are empty.
    cmLinkItem const& item = l;
    if (item.AsStr() == this->Target->GetName() || item.AsStr().empty()) {
      continue;
    }

    // emit a warning if an undefined feature is used as part of
    // an imported target
    if (item.Feature != LinkEntry::DEFAULT &&
        depender_index != cmComputeComponentGraph::INVALID_COMPONENT) {
      const auto& depender = this->EntryList[depender_index];
      if (depender.Target != nullptr && depender.Target->IsImported() &&
          !IsFeatureSupported(this->Makefile, this->LinkLanguage,
                              item.Feature)) {
        this->CMakeInstance->IssueMessage(
          MessageType::AUTHOR_ERROR,
          cmStrCat("The 'IMPORTED' target '", depender.Target->GetName(),
                   "' uses the generator-expression '$<LINK_LIBRARY>' with "
                   "the feature '",
                   item.Feature,
                   "', which is undefined or unsupported.\nDid you miss to "
                   "define it by setting variables \"CMAKE_",
                   this->LinkLanguage, "_LINK_LIBRARY_USING_", item.Feature,
                   "\" and \"CMAKE_", this->LinkLanguage,
                   "_LINK_LIBRARY_USING_", item.Feature, "_SUPPORTED\"?"),
          this->Target->GetBacktrace());
      }
    }

    if (cmHasPrefix(item.AsStr(), LG_BEGIN) &&
        cmHasSuffix(item.AsStr(), '>')) {
      groupIndex = this->AddLinkEntry(item);
      if (groupIndex.second) {
        LinkEntry& entry = this->EntryList[groupIndex.first];
        entry.Feature = ExtractGroupFeature(item.AsStr());
      }
      inGroup = true;
      if (depender_index != cmComputeComponentGraph::INVALID_COMPONENT) {
        this->EntryConstraintGraph[depender_index].emplace_back(
          groupIndex.first, false, false, cmListFileBacktrace());
      } else {
        // This is a direct dependency of the target being linked.
        this->OriginalEntries.push_back(groupIndex.first);
      }
      continue;
    }

    size_t dependee_index;

    if (cmHasPrefix(item.AsStr(), LG_END) && cmHasSuffix(item.AsStr(), '>')) {
      dependee_index = groupIndex.first;
      if (groupIndex.second) {
        this->GroupItems.emplace(groupIndex.first, groupItems);
      }
      inGroup = false;
      groupIndex = std::make_pair(-1, false);
      groupItems.clear();
      continue;
    }

    if (depender_index != cmComputeComponentGraph::INVALID_COMPONENT &&
        inGroup) {
      const auto& depender = this->EntryList[depender_index];
      const auto& groupFeature = this->EntryList[groupIndex.first].Feature;
      if (depender.Target != nullptr && depender.Target->IsImported() &&
          !IsGroupFeatureSupported(this->Makefile, this->LinkLanguage,
                                   groupFeature)) {
        this->CMakeInstance->IssueMessage(
          MessageType::AUTHOR_ERROR,
          cmStrCat("The 'IMPORTED' target '", depender.Target->GetName(),
                   "' uses the generator-expression '$<LINK_GROUP>' with "
                   "the feature '",
                   groupFeature,
                   "', which is undefined or unsupported.\nDid you miss to "
                   "define it by setting variables \"CMAKE_",
                   this->LinkLanguage, "_LINK_GROUP_USING_", groupFeature,
                   "\" and \"CMAKE_", this->LinkLanguage, "_LINK_GROUP_USING_",
                   groupFeature, "_SUPPORTED\"?"),
          this->Target->GetBacktrace());
      }
    }

    // Add a link entry for this item.
    auto ale = this->AddLinkEntry(item, groupIndex.first);
    dependee_index = ale.first;
    LinkEntry& entry = this->EntryList[dependee_index];
    auto const& itemFeature =
      this->GetCurrentFeature(entry.Item.Value, item.Feature);
    if (inGroup && ale.second && entry.Target != nullptr &&
        (entry.Target->GetType() == cmStateEnums::TargetType::OBJECT_LIBRARY ||
         entry.Target->GetType() ==
           cmStateEnums::TargetType::INTERFACE_LIBRARY)) {
      const auto& groupFeature = this->EntryList[groupIndex.first].Feature;
      this->CMakeInstance->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(
          "The feature '", groupFeature,
          "', specified as part of a generator-expression "
          "'$",
          LG_BEGIN, groupFeature, ">', will not be applied to the ",
          (entry.Target->GetType() == cmStateEnums::TargetType::OBJECT_LIBRARY
             ? "OBJECT"
             : "INTERFACE"),
          " library '", entry.Item.Value, "'."),
        this->Target->GetBacktrace());
    }
    if (ale.second) {
      // current item not yet defined
      if (itemFeature != LinkEntry::DEFAULT && entry.Target != nullptr &&
          (entry.Target->GetType() ==
             cmStateEnums::TargetType::OBJECT_LIBRARY ||
           entry.Target->GetType() ==
             cmStateEnums::TargetType::INTERFACE_LIBRARY)) {
        this->CMakeInstance->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat("The feature '", itemFeature,
                   "', specified as part of a generator-expression "
                   "'$<LINK_LIBRARY:",
                   itemFeature, ">', will not be applied to the ",
                   (entry.Target->GetType() ==
                        cmStateEnums::TargetType::OBJECT_LIBRARY
                      ? "OBJECT"
                      : "INTERFACE"),
                   " library '", entry.Item.Value, "'."),
          this->Target->GetBacktrace());
      }
      entry.Feature = itemFeature;
    }

    bool supportedItem = entry.Target == nullptr ||
      (entry.Target->GetType() != cmStateEnums::TargetType::OBJECT_LIBRARY &&
       entry.Target->GetType() != cmStateEnums::TargetType::INTERFACE_LIBRARY);

    if (supportedItem) {
      if (inGroup) {
        const auto& currentFeature = this->EntryList[groupIndex.first].Feature;
        for (const auto& g : this->GroupItems) {
          const auto& groupFeature = this->EntryList[g.first].Feature;
          if (groupFeature == currentFeature) {
            continue;
          }
          if (std::find(g.second.cbegin(), g.second.cend(), dependee_index) !=
              g.second.cend()) {
            this->CMakeInstance->IssueMessage(
              MessageType::FATAL_ERROR,
              cmStrCat("Impossible to link target '", this->Target->GetName(),
                       "' because the link item '", entry.Item.Value,
                       "', specified with the group feature '", currentFeature,
                       '\'', ", has already occurred with the feature '",
                       groupFeature, '\'', ", which is not allowed."),
              this->Target->GetBacktrace());
            continue;
          }
        }
      }
      if (entry.Feature != itemFeature) {
        // incompatibles features occurred
        this->CMakeInstance->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Impossible to link target '", this->Target->GetName(),
                   "' because the link item '", entry.Item.Value,
                   "', specified ",
                   (itemFeature == LinkEntry::DEFAULT
                      ? "without any feature or 'DEFAULT' feature"
                      : cmStrCat("with the feature '", itemFeature, '\'')),
                   ", has already occurred ",
                   (entry.Feature == LinkEntry::DEFAULT
                      ? "without any feature or 'DEFAULT' feature"
                      : cmStrCat("with the feature '", entry.Feature, '\'')),
                   ", which is not allowed."),
          this->Target->GetBacktrace());
      }
    }

    if (inGroup) {
      // store item index for dependencies handling
      groupItems.push_back(dependee_index);
    } else {
      std::vector<size_t> indexes;
      bool entryHandled = false;
      // search any occurrence of the library in already defined groups
      for (const auto& group : this->GroupItems) {
        for (auto index : group.second) {
          if (entry.Item.Value == this->EntryList[index].Item.Value) {
            indexes.push_back(group.first);
            entryHandled = true;
            break;
          }
        }
      }
      if (!entryHandled) {
        indexes.push_back(dependee_index);
      }

      for (auto index : indexes) {
        // The dependee must come after the depender.
        if (depender_index != cmComputeComponentGraph::INVALID_COMPONENT) {
          this->EntryConstraintGraph[depender_index].emplace_back(
            index, false, false, cmListFileBacktrace());
        } else {
          // This is a direct dependency of the target being linked.
          this->OriginalEntries.push_back(index);
        }

        // Update the inferred dependencies for earlier items.
        for (auto& dependSet : dependSets) {
          // Add this item to the inferred dependencies of other items.
          // Target items are never inferred dependees because unknown
          // items are outside libraries that should not be depending on
          // targets.
          if (!this->EntryList[index].Target &&
              this->EntryList[index].Kind != LinkEntry::Flag &&
              this->EntryList[index].Kind != LinkEntry::Group &&
              dependee_index != dependSet.first) {
            dependSet.second.insert(index);
          }
        }

        // If this item needs to have dependencies inferred, do so.
        if (this->InferredDependSets[index].Initialized) {
          // Make sure an entry exists to hold the set for the item.
          dependSets[index];
        }
      }
    }
  }

  // Store the inferred dependency sets discovered for this list.
  for (auto const& dependSet : dependSets) {
    this->InferredDependSets[dependSet.first].push_back(dependSet.second);
  }
}